

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O2

void __thiscall
BayesianGameForDecPOMDPStage::Fill_joI_Array
          (BayesianGameForDecPOMDPStage *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indTypes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI,Index *joI_arr)

{
  value_type vVar1;
  PlanningUnitDecPOMDPDiscrete *this_00;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  int iVar3;
  Index IVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference this_01;
  reference pvVar5;
  Index tI;
  size_type __n;
  uint agentI;
  ulong __n_00;
  long lVar6;
  ulong __n_01;
  undefined8 uStack_c0;
  Index aIStack_b8 [2];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  undefined1 local_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indOHI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivObservations;
  allocator_type local_32;
  allocator_type local_31;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,indTypes);
  iVar3 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
            super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
            super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0,
             CONCAT44(extraout_var,iVar3),&local_32);
  __n_01 = (ulong)ts;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)&indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,__n_01,(value_type *)&local_b0,&local_31);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_b0);
  agentI = 0;
  while( true ) {
    iVar3 = (*(this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    __n_00 = (ulong)agentI;
    if (CONCAT44(extraout_var_00,iVar3) <= __n_00) break;
    lVar6 = -(__n_01 * 4 + 0xf & 0xfffffffffffffff0);
    *(pointer)((long)local_98 + __n_00 * 4) =
         *(pointer)((long)local_98 + __n_00 * 4) +
         (firstOHtsI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start[__n_00];
    IVar4 = *(Index *)((long)local_98 + __n_00 * 4);
    this_00 = this->_m_pu;
    *(undefined8 *)((long)&uStack_c0 + lVar6) = 0x3f5e7c;
    PlanningUnitMADPDiscrete::GetObservationHistoryArrays
              (&this_00->super_PlanningUnitMADPDiscrete,agentI,IVar4,ts,
               (Index *)((long)aIStack_b8 + lVar6));
    for (__n = 0; __n_01 != __n; __n = __n + 1) {
      vVar1 = ((Index *)((long)aIStack_b8 + lVar6))[__n];
      *(undefined8 *)((long)&uStack_c0 + lVar6) = 0x3f5e94;
      this_01 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)&indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,__n);
      *(undefined8 *)((long)&uStack_c0 + lVar6) = 0x3f5e9f;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n_00);
      *pvVar5 = vVar1;
    }
    agentI = agentI + 1;
  }
  for (lVar6 = 0; __n_01 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
    pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
    IVar4 = (**(code **)((long)*pMVar2 + 0xe0))
                      (pMVar2,(long)indOHI.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + lVar6);
    *joI_arr = IVar4;
    joI_arr = joI_arr + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&indOHI.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::Fill_joI_Array(const Index ts, 
        const vector<Index>& indTypes, 
        const vector<Index>& firstOHtsI, 
        Index* joI_arr)
{           
    //convert indiv type indices to ind. observation history indices:
    vector<Index> indOHI = vector<Index>(indTypes);
    // indivObservations[ti][agI]  will contain the observation agI received at tI+1
    vector< vector<Index> > indivObservations(ts,vector<Index>(GetNrAgents()) );
    for(Index agentI=0; agentI < GetNrAgents(); agentI++)
    {
        indOHI[agentI] += firstOHtsI[agentI];
        Index obsArr[ts];
        _m_pu->GetObservationHistoryArrays(agentI, indOHI[agentI], ts, obsArr);
        //now obsArr is filled and can be copied into indivObservations
        for(Index tI=0; tI < ts; tI++)
            indivObservations.at(tI).at(agentI) = obsArr[tI];
    }

    for(Index tI=0; tI < ts; tI++)
        joI_arr[tI] = _m_pu->IndividualToJointObservationIndices(
                indivObservations[tI] );
}